

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O0

void AssignSegments(VP8Encoder *enc,int *alphas)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_RSI;
  long *in_RDI;
  bool bVar5;
  int smooth;
  int alpha;
  VP8MBInfo *mb;
  int new_center;
  int displaced;
  int total_weight;
  int dist_accum [4];
  int accum [4];
  int range_a;
  int max_a;
  int min_a;
  int k;
  int n;
  int a;
  int map [256];
  int weighted_average;
  int centers [4];
  int nb;
  int local_49c;
  byte *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  int in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  int aiStack_478 [4];
  int aiStack_468 [2];
  VP8Encoder *in_stack_fffffffffffffba0;
  int local_444;
  int local_440;
  int local_43c;
  int aiStack_438 [259];
  int local_2c;
  int local_28 [5];
  int local_14;
  long local_10;
  long *local_8;
  
  if ((int)in_RDI[4] < 4) {
    local_49c = (int)in_RDI[4];
  }
  else {
    local_49c = 4;
  }
  local_14 = local_49c;
  local_2c = 0;
  local_440 = 0;
  while( true ) {
    iVar1 = local_440;
    bVar5 = false;
    if (local_440 < 0x100) {
      bVar5 = *(int *)(in_RSI + (long)local_440 * 4) == 0;
    }
    if (!bVar5) break;
    local_440 = local_440 + 1;
  }
  local_440 = 0xff;
  while( true ) {
    iVar2 = local_440;
    bVar5 = false;
    if (iVar1 < local_440) {
      bVar5 = *(int *)(in_RSI + (long)local_440 * 4) == 0;
    }
    if (!bVar5) break;
    local_440 = local_440 + -1;
  }
  iVar3 = local_440 - iVar1;
  local_440 = 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_444 = 0; local_444 < local_14; local_444 = local_444 + 1) {
    local_28[local_444] = iVar1 + (local_440 * iVar3) / (local_14 << 1);
    local_440 = local_440 + 2;
  }
  for (local_444 = 0; local_444 < 6; local_444 = local_444 + 1) {
    for (local_440 = 0; local_440 < local_14; local_440 = local_440 + 1) {
      aiStack_468[local_440] = 0;
      aiStack_478[local_440] = 0;
    }
    local_440 = 0;
    for (local_43c = iVar1; local_43c <= iVar2; local_43c = local_43c + 1) {
      if (*(int *)(local_10 + (long)local_43c * 4) != 0) {
        while( true ) {
          bVar5 = false;
          if (local_440 + 1 < local_14) {
            iVar3 = local_43c - local_28[local_440 + 1];
            if (iVar3 < 1) {
              iVar3 = -iVar3;
            }
            iVar4 = local_43c - local_28[local_440];
            if (iVar4 < 1) {
              iVar4 = -iVar4;
            }
            bVar5 = iVar3 < iVar4;
          }
          if (!bVar5) break;
          local_440 = local_440 + 1;
        }
        aiStack_438[local_43c] = local_440;
        aiStack_478[local_440] =
             local_43c * *(int *)(local_10 + (long)local_43c * 4) + aiStack_478[local_440];
        aiStack_468[local_440] = *(int *)(local_10 + (long)local_43c * 4) + aiStack_468[local_440];
      }
    }
    in_stack_fffffffffffffb80 = 0;
    local_2c = 0;
    in_stack_fffffffffffffb84 = 0;
    for (local_440 = 0; local_440 < local_14; local_440 = local_440 + 1) {
      if (aiStack_468[local_440] != 0) {
        in_stack_fffffffffffffb7c =
             (aiStack_478[local_440] + aiStack_468[local_440] / 2) / aiStack_468[local_440];
        iVar3 = local_28[local_440] - in_stack_fffffffffffffb7c;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        in_stack_fffffffffffffb80 = iVar3 + in_stack_fffffffffffffb80;
        local_28[local_440] = in_stack_fffffffffffffb7c;
        local_2c = in_stack_fffffffffffffb7c * aiStack_468[local_440] + local_2c;
        in_stack_fffffffffffffb84 = aiStack_468[local_440] + in_stack_fffffffffffffb84;
      }
    }
    local_2c = (local_2c + in_stack_fffffffffffffb84 / 2) / in_stack_fffffffffffffb84;
    if (in_stack_fffffffffffffb80 < 5) break;
  }
  for (local_440 = 0; local_440 < (int)local_8[6] * *(int *)((long)local_8 + 0x34);
      local_440 = local_440 + 1) {
    in_stack_fffffffffffffb70 = (byte *)(local_8[0xb8c] + (long)local_440 * 4);
    *in_stack_fffffffffffffb70 =
         *in_stack_fffffffffffffb70 & 0x9f |
         ((byte)aiStack_438[(int)(uint)in_stack_fffffffffffffb70[1]] & 3) << 5;
    in_stack_fffffffffffffb70[1] =
         (byte)local_28[aiStack_438[(int)(uint)in_stack_fffffffffffffb70[1]]];
  }
  if ((1 < local_14) && ((*(uint *)(*local_8 + 0x44) & 1) != 0)) {
    SmoothSegmentMap(in_stack_fffffffffffffba0);
  }
  SetSegmentAlphas((VP8Encoder *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                   (int *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                   (int)((ulong)in_stack_fffffffffffffb70 >> 0x20));
  return;
}

Assistant:

static void AssignSegments(VP8Encoder* const enc,
                           const int alphas[MAX_ALPHA + 1]) {
  // 'num_segments_' is previously validated and <= NUM_MB_SEGMENTS, but an
  // explicit check is needed to avoid spurious warning about 'n + 1' exceeding
  // array bounds of 'centers' with some compilers (noticed with gcc-4.9).
  const int nb = (enc->segment_hdr_.num_segments_ < NUM_MB_SEGMENTS) ?
                 enc->segment_hdr_.num_segments_ : NUM_MB_SEGMENTS;
  int centers[NUM_MB_SEGMENTS];
  int weighted_average = 0;
  int map[MAX_ALPHA + 1];
  int a, n, k;
  int min_a = 0, max_a = MAX_ALPHA, range_a;
  // 'int' type is ok for histo, and won't overflow
  int accum[NUM_MB_SEGMENTS], dist_accum[NUM_MB_SEGMENTS];

  assert(nb >= 1);
  assert(nb <= NUM_MB_SEGMENTS);

  // bracket the input
  for (n = 0; n <= MAX_ALPHA && alphas[n] == 0; ++n) {}
  min_a = n;
  for (n = MAX_ALPHA; n > min_a && alphas[n] == 0; --n) {}
  max_a = n;
  range_a = max_a - min_a;

  // Spread initial centers evenly
  for (k = 0, n = 1; k < nb; ++k, n += 2) {
    assert(n < 2 * nb);
    centers[k] = min_a + (n * range_a) / (2 * nb);
  }

  for (k = 0; k < MAX_ITERS_K_MEANS; ++k) {     // few iters are enough
    int total_weight;
    int displaced;
    // Reset stats
    for (n = 0; n < nb; ++n) {
      accum[n] = 0;
      dist_accum[n] = 0;
    }
    // Assign nearest center for each 'a'
    n = 0;    // track the nearest center for current 'a'
    for (a = min_a; a <= max_a; ++a) {
      if (alphas[a]) {
        while (n + 1 < nb && abs(a - centers[n + 1]) < abs(a - centers[n])) {
          n++;
        }
        map[a] = n;
        // accumulate contribution into best centroid
        dist_accum[n] += a * alphas[a];
        accum[n] += alphas[a];
      }
    }
    // All point are classified. Move the centroids to the
    // center of their respective cloud.
    displaced = 0;
    weighted_average = 0;
    total_weight = 0;
    for (n = 0; n < nb; ++n) {
      if (accum[n]) {
        const int new_center = (dist_accum[n] + accum[n] / 2) / accum[n];
        displaced += abs(centers[n] - new_center);
        centers[n] = new_center;
        weighted_average += new_center * accum[n];
        total_weight += accum[n];
      }
    }
    weighted_average = (weighted_average + total_weight / 2) / total_weight;
    if (displaced < 5) break;   // no need to keep on looping...
  }

  // Map each original value to the closest centroid
  for (n = 0; n < enc->mb_w_ * enc->mb_h_; ++n) {
    VP8MBInfo* const mb = &enc->mb_info_[n];
    const int alpha = mb->alpha_;
    mb->segment_ = map[alpha];
    mb->alpha_ = centers[map[alpha]];  // for the record.
  }

  if (nb > 1) {
    const int smooth = (enc->config_->preprocessing & 1);
    if (smooth) SmoothSegmentMap(enc);
  }

  SetSegmentAlphas(enc, centers, weighted_average);  // pick some alphas.
}